

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

void Frc_ManPlacementRefine(Frc_Man_t *p,int nIters,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *vCoOrder;
  int *piVar6;
  float *pfVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint *puVar12;
  size_t __size;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  int nCutCur2;
  timespec ts;
  uint local_84;
  timespec local_80;
  ulong local_70;
  int local_64;
  long local_60;
  double local_58;
  int *local_50;
  float *local_48;
  double local_40;
  long local_38;
  
  local_64 = fVerbose;
  iVar3 = clock_gettime(3,&local_80);
  if (iVar3 < 0) {
    local_60 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    local_60 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  vCoOrder = Frc_ManCollectCos(p);
  iVar3 = Frc_ManPlaceDfsBoth(p,vCoOrder,(int *)&local_84);
  __size = (long)p->nObjs << 2;
  piVar6 = (int *)malloc(__size);
  pfVar7 = (float *)malloc(__size);
  if (0 < nIters) {
    local_58 = (double)iVar3;
    lVar11 = 0;
    local_70 = 0;
    local_50 = piVar6;
    local_48 = pfVar7;
    do {
      pfVar7 = local_48;
      iVar4 = p->nObjData;
      local_40 = 0.0;
      if ((0 < iVar4) && (puVar12 = (uint *)p->pObjData, puVar12 != (uint *)0x0)) {
        iVar10 = 0;
        do {
          uVar5 = puVar12[4];
          uVar1 = puVar12[1];
          uVar13 = uVar5;
          if (0 < (long)(int)uVar1) {
            lVar14 = 0;
            do {
              uVar2 = puVar12[(long)(int)puVar12[(ulong)(*puVar12 >> 4) + lVar14 + 6] + 4];
              if ((int)uVar2 <= (int)uVar13) {
                uVar13 = uVar2;
              }
              if ((int)uVar5 <= (int)uVar2) {
                uVar5 = uVar2;
              }
              lVar14 = lVar14 + 1;
            } while ((int)uVar1 != lVar14);
          }
          puVar12[5] = (uint)((float)(int)(uVar5 + uVar13) * 0.5);
          local_40 = local_40 + (double)(int)(uVar5 - uVar13);
          iVar10 = iVar10 + uVar1 + (*puVar12 >> 4) + 6;
          iVar4 = p->nObjData;
        } while ((iVar10 < iVar4) &&
                (puVar12 = (uint *)(p->pObjData + iVar10), p->pObjData != (int *)0x0));
      }
      if (iVar4 < 1) {
        lVar14 = 0;
      }
      else {
        piVar8 = p->pObjData;
        lVar14 = 0;
        iVar10 = 0;
        do {
          if (piVar8 == (int *)0x0) break;
          puVar12 = (uint *)(piVar8 + iVar10);
          fVar17 = (float)puVar12[5];
          uVar5 = *puVar12 >> 4;
          if (0xf < *puVar12) {
            uVar15 = 0;
            do {
              fVar17 = fVar17 + (float)puVar12[5 - (long)(int)puVar12[uVar15 + 6]];
              uVar15 = uVar15 + 1;
            } while (uVar5 != uVar15);
          }
          local_48[lVar14] = fVar17 / (float)(uVar5 + 1);
          piVar6[lVar14] = iVar10;
          lVar14 = lVar14 + 1;
          iVar10 = puVar12[1] + (*puVar12 >> 4) + iVar10 + 6;
        } while (iVar10 < iVar4);
      }
      if ((int)lVar14 != p->nObjs) {
        __assert_fail("Counter == Frc_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                      ,0x3a3,"void Frc_ManPlacementRefine(Frc_Man_t *, int, int)");
      }
      local_38 = lVar11;
      iVar4 = clock_gettime(3,&local_80);
      if (iVar4 < 0) {
        lVar14 = 1;
      }
      else {
        lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
        lVar14 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_80.tv_sec * -1000000;
      }
      piVar8 = Gia_SortFloats(pfVar7,piVar6,p->nObjs);
      iVar4 = clock_gettime(3,&local_80);
      if (iVar4 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
      if (piVar8 != piVar6) {
        __assert_fail("pPermX == pHandles",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                      ,0x3a8,"void Frc_ManPlacementRefine(Frc_Man_t *, int, int)");
      }
      vCoOrder->nSize = 0;
      if (0 < p->nObjs) {
        lVar16 = 0;
        do {
          lVar9 = (long)piVar8[lVar16];
          piVar6 = p->pObjData;
          piVar6[lVar9 + 4] = (int)lVar16;
          if ((*(byte *)(piVar6 + lVar9) & 2) != 0) {
            Vec_IntPush(vCoOrder,piVar6[lVar9 + 3]);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < p->nObjs);
      }
      lVar11 = local_38 + lVar14 + lVar11;
      uVar5 = Frc_ManPlaceDfsBoth(p,vCoOrder,(int *)&local_84);
      piVar6 = local_50;
      if (local_64 != 0) {
        printf("%2d : Span = %e  ",local_40,(ulong)((int)local_70 + 1));
        iVar4 = 0x9f388a;
        printf("Cut = %6d  (%5.2f %%)  CutR = %6d  ",
               ((double)(int)(iVar3 - uVar5) * 100.0) / local_58,(ulong)uVar5,(ulong)local_84);
        Abc_Print(iVar4,"%s =","Total");
        iVar10 = 3;
        iVar4 = clock_gettime(3,&local_80);
        if (iVar4 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
        }
        Abc_Print(iVar10,"%9.2f sec  ",(double)(lVar14 + local_60) / 1000000.0);
        Abc_Print(iVar10,"%s =","Sort");
        Abc_Print(iVar10,"%9.2f sec\n",(double)lVar11 / 1000000.0);
      }
      uVar5 = (int)local_70 + 1;
      local_70 = (ulong)uVar5;
      pfVar7 = local_48;
    } while (uVar5 != nIters);
  }
  if (piVar6 != (int *)0x0) {
    free(piVar6);
  }
  if (pfVar7 != (float *)0x0) {
    free(pfVar7);
  }
  if (vCoOrder->pArray != (int *)0x0) {
    free(vCoOrder->pArray);
    vCoOrder->pArray = (int *)0x0;
  }
  if (vCoOrder != (Vec_Int_t *)0x0) {
    free(vCoOrder);
  }
  return;
}

Assistant:

void Frc_ManPlacementRefine( Frc_Man_t * p, int nIters, int fVerbose )
{
    int fRandomize = 0;
    Vec_Int_t * vCoOrder;
    Frc_Obj_t * pThis, * pNext;
    double CostThis, CostPrev;
    float * pVertX, VertX;
    int * pPermX, * pHandles;
    int k, h, Iter, iMinX, iMaxX, Counter, nCutStart, nCutCur, nCutCur2, nCutPrev;
    abctime clk = Abc_Clock(), clk2, clk2Total = 0;
    // create starting one-dimensional placement
    vCoOrder = Frc_ManCollectCos( p );
    if ( fRandomize )
        Frc_ManArrayShuffle( vCoOrder );
    nCutStart = Frc_ManPlaceDfsBoth( p, vCoOrder, &nCutCur2 );
    // refine placement
    CostPrev = 0.0;
    nCutPrev = nCutStart;
    pHandles = ABC_ALLOC( int, p->nObjs );
    pVertX   = ABC_ALLOC( float, p->nObjs );
    for ( Iter = 0; Iter < nIters; Iter++ )
    {
        // compute centers of hyperedges
        CostThis = 0.0;
        Frc_ManForEachObj( p, pThis, h )
        {
            iMinX = iMaxX = pThis->pPlace;
            Frc_ObjForEachFanout( pThis, pNext, k )
            {
                iMinX = Abc_MinInt( iMinX, pNext->pPlace );
                iMaxX = Abc_MaxInt( iMaxX, pNext->pPlace );
            }
            pThis->fEdgeCenter = 0.5 * (iMaxX + iMinX);
            CostThis += (iMaxX - iMinX);
        }
        // compute new centers of objects
        Counter = 0;
        Frc_ManForEachObj( p, pThis, h )
        {
            VertX = pThis->fEdgeCenter;
            Frc_ObjForEachFanin( pThis, pNext, k )
                VertX += pNext->fEdgeCenter;
            pVertX[Counter] = VertX / (Frc_ObjFaninNum(pThis) + 1);
            pHandles[Counter++] = h;
        }
        assert( Counter == Frc_ManObjNum(p) );
        // sort these numbers
        clk2 = Abc_Clock();
        pPermX = Gia_SortFloats( pVertX, pHandles, p->nObjs );
        clk2Total += Abc_Clock() - clk2;
        assert( pPermX == pHandles );
        Vec_IntClear( vCoOrder );
        for ( k = 0; k < p->nObjs; k++ )
        {
            pThis = Frc_ManObj( p, pPermX[k] );
            pThis->pPlace = k;
            if ( Frc_ObjIsCo(pThis) )
                Vec_IntPush( vCoOrder, pThis->hHandle );
        }
/*
        printf( "Ordering of PIs:\n" );
        Frc_ManForEachCi( p, pThis, k )
            printf( "PI number = %7d.  Object handle = %7d,  Coordinate = %7d.\n", 
                k, pThis->hHandle, pThis->pPlace );
*/
        nCutCur = Frc_ManPlaceDfsBoth( p, vCoOrder, &nCutCur2 );
        // evaluate cost
        if ( fVerbose )
        {
            printf( "%2d : Span = %e  ", Iter+1, CostThis );
            printf( "Cut = %6d  (%5.2f %%)  CutR = %6d  ", nCutCur, 100.0*(nCutStart-nCutCur)/nCutStart, nCutCur2 );
            ABC_PRTn( "Total", Abc_Clock() - clk );
            ABC_PRT( "Sort", clk2Total );
//        Frc_ManCrossCutTest( p, vCoOrder );
        }
//        if ( 1.0 * nCutPrev / nCutCur < 1.001 )
//            break;
        nCutPrev = nCutCur;
    }
    ABC_FREE( pHandles );
    ABC_FREE( pVertX );
    Vec_IntFree( vCoOrder );
}